

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O1

Reals __thiscall
Omega_h::get_curv_vert_curvatures_dim<2>
          (Omega_h *this,Mesh *mesh,LOs *curv_edge2edge,Reals *curv_edge_curvatures,
          LOs *curv_vert2vert)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  LO LVar4;
  LO nb;
  void *extraout_RDX;
  size_t sVar5;
  Reals RVar6;
  Write<double> curv_vert_curvatures_w;
  Reals curv_vert_curvatures;
  type f;
  Reals coords;
  Read<signed_char> verts_not_curv;
  LOs edges2verts;
  Read<signed_char> edges_touch_bdry;
  LOs edge2curv_edge;
  Adj verts2edges;
  Write<double> local_1f8;
  Omega_h *local_1e8;
  Omega_h *local_1e0;
  LOs local_1d8;
  LOs local_1c8;
  LOs local_1b8;
  Alloc *local_1a8;
  void *local_1a0;
  Write<double> local_198;
  Read<signed_char> local_188;
  type local_178;
  Alloc *local_d8;
  element_type *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  pointer local_c0;
  Alloc *local_b8;
  element_type *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  Read<signed_char> local_a0;
  Alloc *local_90;
  pointer local_88;
  Read<signed_char> local_80;
  Alloc *local_70;
  pointer local_68;
  Adj local_60;
  
  Mesh::ask_up(&local_60,mesh,0,1);
  Mesh::ask_verts_of((Mesh *)&local_b8,(Int)mesh);
  local_1b8.write_.shared_alloc_.alloc = (curv_edge2edge->write_).shared_alloc_.alloc;
  if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8.write_.shared_alloc_.alloc =
           (Alloc *)((local_1b8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1b8.write_.shared_alloc_.alloc)->use_count =
           (local_1b8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1b8.write_.shared_alloc_.direct_ptr = (curv_edge2edge->write_).shared_alloc_.direct_ptr;
  LVar4 = Mesh::nedges(mesh);
  invert_injective_map((Omega_h *)&local_70,&local_1b8,LVar4);
  pAVar3 = local_1b8.write_.shared_alloc_.alloc;
  if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1b8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1b8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = (curv_vert2vert->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar5 = pAVar3->size;
  }
  else {
    sVar5 = (ulong)pAVar3 >> 3;
  }
  local_178.curv_vert2vert.write_.shared_alloc_.alloc = (Alloc *)&local_178.verts2edges;
  local_1e0 = (Omega_h *)&local_70;
  local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
  LVar4 = (LO)(sVar5 >> 2);
  Read<signed_char>::Read(&local_80,LVar4,'\0',(string *)&local_178);
  local_1c8.write_.shared_alloc_.alloc = (curv_vert2vert->write_).shared_alloc_.alloc;
  if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8.write_.shared_alloc_.alloc =
           (Alloc *)((local_1c8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1c8.write_.shared_alloc_.alloc)->use_count =
           (local_1c8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1c8.write_.shared_alloc_.direct_ptr = (curv_vert2vert->write_).shared_alloc_.direct_ptr;
  nb = Mesh::nverts(mesh);
  map_onto<signed_char>((Omega_h *)&local_c8,&local_80,&local_1c8,nb,'\x01',1);
  pAVar3 = local_1c8.write_.shared_alloc_.alloc;
  if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1c8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1c8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(local_80.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (local_178.curv_vert2vert.write_.shared_alloc_.alloc != (Alloc *)&local_178.verts2edges) {
    operator_delete(local_178.curv_vert2vert.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_178.verts2edges.super_Graph.a2ab.write_.shared_alloc_.
                                   alloc)->size + 1));
  }
  local_a0.write_.shared_alloc_.alloc = (Alloc *)local_c8._M_pi;
  if (((ulong)local_c8._M_pi & 7) == 0 && (Alloc *)local_c8._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_c8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_c8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_c8._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = local_c0;
  local_1e8 = (Omega_h *)&local_90;
  mark_up(local_1e8,mesh,0,1,&local_a0);
  pAVar3 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  Mesh::coords((Mesh *)&local_d8);
  local_178.curv_vert2vert.write_.shared_alloc_.alloc = (Alloc *)&local_178.verts2edges;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
  Write<double>::Write(&local_1f8,LVar4,(string *)&local_178);
  if (local_178.curv_vert2vert.write_.shared_alloc_.alloc != (Alloc *)&local_178.verts2edges) {
    operator_delete(local_178.curv_vert2vert.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_178.verts2edges.super_Graph.a2ab.write_.shared_alloc_.
                                   alloc)->size + 1));
  }
  this_00._M_pi = local_a8._M_pi;
  local_178.curv_vert2vert.write_.shared_alloc_.alloc = (curv_vert2vert->write_).shared_alloc_.alloc
  ;
  if (((ulong)local_178.curv_vert2vert.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.curv_vert2vert.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.curv_vert2vert.write_.shared_alloc_.alloc =
           (Alloc *)((local_178.curv_vert2vert.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_178.curv_vert2vert.write_.shared_alloc_.alloc)->use_count =
           (local_178.curv_vert2vert.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_178.curv_vert2vert.write_.shared_alloc_.direct_ptr =
       (curv_vert2vert->write_).shared_alloc_.direct_ptr;
  local_178.verts2edges.super_Graph.a2ab.write_.shared_alloc_.alloc =
       local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.verts2edges.super_Graph.a2ab.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_178.verts2edges.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
       local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_178.verts2edges.super_Graph.ab2b.write_.shared_alloc_.alloc =
       local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.verts2edges.super_Graph.ab2b.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_178.verts2edges.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
       local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_178.verts2edges.codes.write_.shared_alloc_.alloc = local_60.codes.write_.shared_alloc_.alloc
  ;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.verts2edges.codes.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_178.verts2edges.codes.write_.shared_alloc_.direct_ptr =
       local_60.codes.write_.shared_alloc_.direct_ptr;
  local_178.edges_touch_bdry.write_.shared_alloc_.alloc = local_90;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.edges_touch_bdry.write_.shared_alloc_.alloc = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  local_178.edges_touch_bdry.write_.shared_alloc_.direct_ptr = local_88;
  local_178.edge2curv_edge.write_.shared_alloc_.alloc = local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.edge2curv_edge.write_.shared_alloc_.alloc = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_178.edge2curv_edge.write_.shared_alloc_.direct_ptr = local_68;
  local_178.edges2verts.write_.shared_alloc_.alloc = local_b8;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.edges2verts.write_.shared_alloc_.alloc = (Alloc *)(local_b8->size * 8 + 1);
    }
    else {
      local_b8->use_count = local_b8->use_count + 1;
    }
  }
  local_178.edges2verts.write_.shared_alloc_.direct_ptr = local_b0;
  local_178.coords.write_.shared_alloc_.alloc = local_d8;
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.coords.write_.shared_alloc_.alloc = (Alloc *)(local_d8->size * 8 + 1);
    }
    else {
      local_d8->use_count = local_d8->use_count + 1;
    }
  }
  local_178.coords.write_.shared_alloc_.direct_ptr = local_d0;
  local_178.curv_edge_curvatures.write_.shared_alloc_.alloc =
       (curv_edge_curvatures->write_).shared_alloc_.alloc;
  if (((ulong)local_178.curv_edge_curvatures.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.curv_edge_curvatures.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.curv_edge_curvatures.write_.shared_alloc_.alloc =
           (Alloc *)((local_178.curv_edge_curvatures.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_178.curv_edge_curvatures.write_.shared_alloc_.alloc)->use_count =
           (local_178.curv_edge_curvatures.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_178.curv_edge_curvatures.write_.shared_alloc_.direct_ptr =
       (curv_edge_curvatures->write_).shared_alloc_.direct_ptr;
  local_178.curv_vert_curvatures_w.shared_alloc_.alloc = local_1f8.shared_alloc_.alloc;
  if (((ulong)local_1f8.shared_alloc_.alloc & 7) == 0 &&
      local_1f8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.curv_vert_curvatures_w.shared_alloc_.alloc =
           (Alloc *)((local_1f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1f8.shared_alloc_.alloc)->use_count = (local_1f8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_178.curv_vert_curvatures_w.shared_alloc_.direct_ptr = local_1f8.shared_alloc_.direct_ptr;
  parallel_for<Omega_h::get_curv_vert_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>)::_lambda(int)_1_>
            (LVar4,&local_178,"get_curv_vert_curvatures");
  local_198.shared_alloc_.alloc = local_1f8.shared_alloc_.alloc;
  if (((ulong)local_1f8.shared_alloc_.alloc & 7) == 0 &&
      local_1f8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198.shared_alloc_.alloc = (Alloc *)((local_1f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1f8.shared_alloc_.alloc)->use_count = (local_1f8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_198.shared_alloc_.direct_ptr = local_1f8.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_188,&local_198);
  pAVar3 = local_198.shared_alloc_.alloc;
  if (((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
      local_198.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_198.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_1d8.write_.shared_alloc_.alloc = local_188.write_.shared_alloc_.alloc;
  if (((ulong)local_188.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8.write_.shared_alloc_.alloc =
           (Alloc *)((local_188.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_188.write_.shared_alloc_.alloc)->use_count =
           (local_188.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1d8.write_.shared_alloc_.direct_ptr = local_188.write_.shared_alloc_.direct_ptr;
  local_1a8 = (curv_vert2vert->write_).shared_alloc_.alloc;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    else {
      local_1a8->use_count = local_1a8->use_count + 1;
    }
  }
  local_1a0 = (curv_vert2vert->write_).shared_alloc_.direct_ptr;
  Mesh::sync_subset_array<double>
            ((Mesh *)this_00._M_pi,(Int)mesh,(Read<double> *)0x0,&local_1d8,0.0,(Int)&local_1a8);
  pAVar3 = local_1a8;
  if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
    piVar1 = &local_1a8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a8);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_1d8.write_.shared_alloc_.alloc;
  if (((ulong)local_1d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1d8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (((ulong)local_188.write_.shared_alloc_.alloc & 7) == 0 &&
      local_188.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_188.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188.write_.shared_alloc_.alloc);
      operator_delete(local_188.write_.shared_alloc_.alloc,0x48);
    }
  }
  get_curv_vert_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&local_178);
  if (((ulong)local_1f8.shared_alloc_.alloc & 7) == 0 &&
      local_1f8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1f8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1f8.shared_alloc_.alloc);
      operator_delete(local_1f8.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
    piVar1 = &local_d8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8);
      operator_delete(local_d8,0x48);
    }
  }
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    piVar1 = &local_90->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90);
      operator_delete(local_90,0x48);
    }
  }
  if (((ulong)local_c8._M_pi & 7) == 0 && (Alloc *)local_c8._M_pi != (Alloc *)0x0) {
    p_Var2 = local_c8._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_c8._M_pi);
      operator_delete(local_c8._M_pi,0x48);
    }
  }
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    piVar1 = &local_70->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70);
      operator_delete(local_70,0x48);
    }
  }
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    piVar1 = &local_b8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8);
      operator_delete(local_b8,0x48);
    }
  }
  Adj::~Adj(&local_60);
  RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this_00._M_pi;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals get_curv_vert_curvatures_dim(Mesh* mesh, LOs curv_edge2edge,
    Reals curv_edge_curvatures, LOs curv_vert2vert) {
  auto verts2edges = mesh->ask_up(VERT, EDGE);
  auto edges2verts = mesh->ask_verts_of(EDGE);
  auto edge2curv_edge = invert_injective_map(curv_edge2edge, mesh->nedges());
  auto ncurv_verts = curv_vert2vert.size();
  auto verts_not_curv = map_onto(
      Read<I8>(ncurv_verts, I8(0)), curv_vert2vert, mesh->nverts(), I8(1), 1);
  auto edges_touch_bdry = mark_up(mesh, VERT, EDGE, verts_not_curv);
  auto coords = mesh->coords();
  auto curv_vert_curvatures_w = Write<Real>(ncurv_verts);
  auto f = OMEGA_H_LAMBDA(LO curv_vert) {
    auto vert = curv_vert2vert[curv_vert];
    Int nadj_int_edges = 0;
    for (auto ve = verts2edges.a2ab[vert]; ve < verts2edges.a2ab[vert + 1];
         ++ve) {
      auto edge = verts2edges.ab2b[ve];
      nadj_int_edges += !edges_touch_bdry[edge];
    }
    Real ws = 0.0;
    Real curvature = 0.0;
    for (auto ve = verts2edges.a2ab[vert]; ve < verts2edges.a2ab[vert + 1];
         ++ve) {
      auto edge = verts2edges.ab2b[ve];
      auto curv_edge = edge2curv_edge[edge];
      if (curv_edge < 0) continue;
      if (nadj_int_edges && edges_touch_bdry[edge]) continue;
      auto eev2v = gather_verts<2>(edges2verts, edge);
      auto p = gather_vectors<2, dim>(coords, eev2v);
      auto l = norm(p[1] - p[0]);
      auto ec = curv_edge_curvatures[curv_edge];
      curvature += ec * l;
      ws += l;
    }
    curvature /= ws;
    curv_vert_curvatures_w[curv_vert] = curvature;
  };
  parallel_for(ncurv_verts, f, "get_curv_vert_curvatures");
  auto curv_vert_curvatures = Reals(curv_vert_curvatures_w);
  return mesh->sync_subset_array(
      VERT, curv_vert_curvatures, curv_vert2vert, 0.0, 1);
}